

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTaggerValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2001>(Result *__return_storage_ptr__,Model *format)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  WordTagger *this;
  Type *pTVar5;
  SequenceFeatureType *pSVar6;
  StringVector *pSVar7;
  ostream *poVar8;
  char *pcVar9;
  int index;
  ModelDescription *pMVar10;
  int index_00;
  FeatureType *pFVar11;
  Result *this_00;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  int index_01;
  bool bVar12;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int local_214;
  RepeatedPtrFieldBase *local_210;
  int local_204;
  Result *local_200;
  int local_1f8;
  TypeCase local_1f4;
  Result result;
  string name;
  
  pMVar10 = format->description_;
  if (pMVar10 == (ModelDescription *)0x0) {
    pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x7d1) {
    this = Specification::Model::wordtagger(format);
    bVar12 = ((this->tokentagsoutputfeaturename_).ptr_)->_M_string_length != 0;
    uVar1 = bVar12 + 1;
    if (((this->tokensoutputfeaturename_).ptr_)->_M_string_length == 0) {
      uVar1 = (uint)bVar12;
    }
    iVar2 = ((uVar1 - (((this->tokenlocationsoutputfeaturename_).ptr_)->_M_string_length == 0)) + 2)
            - (uint)(((this->tokenlengthsoutputfeaturename_).ptr_)->_M_string_length == 0);
    if ((pMVar10->output_).super_RepeatedPtrFieldBase.current_size_ == iVar2) {
      local_210 = &(pMVar10->output_).super_RepeatedPtrFieldBase;
      iVar3 = -1;
      index = 0;
      local_214 = -1;
      index_00 = -1;
      index_01 = -1;
      local_200 = __return_storage_ptr__;
      while( true ) {
        if (iVar2 <= index) break;
        local_1f8 = iVar3;
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (local_210,index);
        std::__cxx11::string::string((string *)&name,(string *)(pTVar5->name_).ptr_);
        local_204 = std::__cxx11::string::compare((string *)(this->tokensoutputfeaturename_).ptr_);
        if (local_204 == 0) {
          index_01 = index;
        }
        iVar2 = std::__cxx11::string::compare((string *)(this->tokentagsoutputfeaturename_).ptr_);
        if (iVar2 == 0) {
          local_214 = index;
        }
        iVar3 = std::__cxx11::string::compare
                          ((string *)(this->tokenlocationsoutputfeaturename_).ptr_);
        if (iVar3 == 0) {
          index_00 = index;
        }
        iVar4 = std::__cxx11::string::compare((string *)(this->tokenlengthsoutputfeaturename_).ptr_)
        ;
        if ((iVar4 != 0 && iVar3 != 0) && (local_204 != 0 && iVar2 != 0)) {
          std::operator+(&local_238,"Output feature \'",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,&local_238,
                         "\' was not required by the output features of the word tagger model.");
          __return_storage_ptr__ = local_200;
          Result::Result(local_200,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)&result);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&local_238);
          goto LAB_0022b773;
        }
        iVar3 = local_1f8;
        if (iVar4 == 0) {
          iVar3 = index;
        }
        std::__cxx11::string::~string((string *)&name);
        index = index + 1;
        iVar2 = (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
      }
      if (local_214 == -1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "Expected feature \'",(this->tokentagsoutputfeaturename_).ptr_);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result,
                       "\' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description."
                      );
        __return_storage_ptr__ = local_200;
        Result::Result(local_200,INTERFACE_FEATURE_NAME_MISMATCH,&name);
        std::__cxx11::string::~string((string *)&name);
        this_00 = &result;
        goto LAB_0022b77b;
      }
      Result::Result(&result);
      local_1f4 = kStringType;
      __l._M_len = 1;
      __l._M_array = &local_1f4;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_238,__l,&local_239);
      __return_storage_ptr__ = local_200;
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&name,(CoreML *)&pMVar10->input_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_238,
                 in_R8);
      Result::operator=(&result,(Result *)&name);
      std::__cxx11::string::~string((string *)&name._M_string_length);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_238);
      bVar12 = Result::good(&result);
      if (bVar12) {
        uVar1 = (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
        local_1f4 = kSequenceType;
        __l_00._M_len = 1;
        __l_00._M_array = &local_1f4;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_238,__l_00,&local_239);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  ((Result *)&name,(CoreML *)local_210,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(ulong)uVar1,
                   (int)&local_238,in_R8);
        Result::operator=(&result,(Result *)&name);
        std::__cxx11::string::~string((string *)&name._M_string_length);
        std::
        _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)&local_238);
        bVar12 = Result::good(&result);
        if (!bVar12) goto LAB_0022b709;
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (local_210,local_214);
        pFVar11 = pTVar5->type_;
        if (pFVar11 == (FeatureType *)0x0) {
          pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        pSVar6 = Specification::FeatureType::sequencetype(pFVar11);
        if (pSVar6->_oneof_case_[0] == 3) {
          if (index_01 != -1) {
            pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (local_210,index_01);
            pFVar11 = pTVar5->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            pSVar6 = Specification::FeatureType::sequencetype(pFVar11);
            if (pSVar6->_oneof_case_[0] != 3) {
              std::__cxx11::stringstream::stringstream((stringstream *)&name);
              poVar8 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
              pcVar9 = ::MLFeatureTypeType_Name(pSVar6->_oneof_case_[0]);
              poVar8 = std::operator<<(poVar8,pcVar9);
              poVar8 = std::operator<<(poVar8,"\" for feature \"");
              std::operator+(&local_238,(this->tokensoutputfeaturename_).ptr_,"\". Should be: ");
              poVar8 = std::operator<<(poVar8,(string *)&local_238);
              std::operator<<(poVar8,"MLFeatureTypeType_stringType");
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
              goto LAB_0022ba9c;
            }
          }
          if (index_00 != -1) {
            pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (local_210,index_00);
            pFVar11 = pTVar5->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            pSVar6 = Specification::FeatureType::sequencetype(pFVar11);
            if (pSVar6->_oneof_case_[0] != 1) {
              std::__cxx11::stringstream::stringstream((stringstream *)&name);
              poVar8 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
              pcVar9 = ::MLFeatureTypeType_Name(pSVar6->_oneof_case_[0]);
              poVar8 = std::operator<<(poVar8,pcVar9);
              poVar8 = std::operator<<(poVar8,"\" for feature \"");
              std::operator+(&local_238,(this->tokenlocationsoutputfeaturename_).ptr_,
                             "\". Should be: ");
              poVar8 = std::operator<<(poVar8,(string *)&local_238);
              std::operator<<(poVar8,"MLFeatureTypeType_int64Type");
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
              goto LAB_0022ba9c;
            }
          }
          if (iVar3 != -1) {
            pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (local_210,iVar3);
            pFVar11 = pTVar5->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            pSVar6 = Specification::FeatureType::sequencetype(pFVar11);
            if (pSVar6->_oneof_case_[0] != 1) {
              std::__cxx11::stringstream::stringstream((stringstream *)&name);
              poVar8 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
              pcVar9 = ::MLFeatureTypeType_Name(pSVar6->_oneof_case_[0]);
              poVar8 = std::operator<<(poVar8,pcVar9);
              poVar8 = std::operator<<(poVar8,"\" for feature \"");
              std::operator+(&local_238,(this->tokenlengthsoutputfeaturename_).ptr_,
                             "\". Should be: ");
              poVar8 = std::operator<<(poVar8,(string *)&local_238);
              std::operator<<(poVar8,"MLFeatureTypeType_int64Type");
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
              goto LAB_0022ba9c;
            }
          }
          if (this->revision_ == 0) {
            std::__cxx11::string::string
                      ((string *)&name,"Model revision number not set. Must be >= 1",
                       (allocator *)&local_238);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
          }
          else if (this->_oneof_case_[0] == 0) {
LAB_0022baeb:
            std::__cxx11::string::string
                      ((string *)&name,"Model output tags not set. Must have at least one tag",
                       (allocator *)&local_238);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
          }
          else {
            if (this->_oneof_case_[0] == 200) {
              pSVar7 = Specification::CoreMLModels::WordTagger::stringtags(this);
              if ((pSVar7->vector_).super_RepeatedPtrFieldBase.current_size_ < 1) goto LAB_0022baeb;
            }
            if (((this->modelparameterdata_).ptr_)->_M_string_length != 0) goto LAB_0022b709;
            std::__cxx11::string::string
                      ((string *)&name,"Model parameter data not set",(allocator *)&local_238);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
          }
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&name);
          poVar8 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
          pcVar9 = ::MLFeatureTypeType_Name(pSVar6->_oneof_case_[0]);
          poVar8 = std::operator<<(poVar8,pcVar9);
          poVar8 = std::operator<<(poVar8,"\" for feature \"");
          std::operator+(&local_238,(this->tokentagsoutputfeaturename_).ptr_,"\". Should be: ");
          poVar8 = std::operator<<(poVar8,(string *)&local_238);
          std::operator<<(poVar8,"MLFeatureTypeType_stringType");
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
LAB_0022ba9c:
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::stringstream::~stringstream((stringstream *)&name);
        }
      }
      else {
LAB_0022b709:
        Result::Result(__return_storage_ptr__,&result);
      }
      this_00 = (Result *)&result.m_message;
      goto LAB_0022b77b;
    }
    std::__cxx11::string::string
              ((string *)&name,
               "More model output features than the output features of the word tagger model.",
               (allocator *)&result);
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,&name);
  }
  else {
    std::__cxx11::string::string((string *)&name,"Model not a word tagger.",(allocator *)&result);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
  }
LAB_0022b773:
  this_00 = (Result *)&name;
LAB_0022b77b:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordTagger>(const Specification::Model& format) {
        const auto& interface = format.description();
        const auto& inputs = interface.input();
        const auto& outputs = interface.output();
        
        // make sure model is a word tager
        if (!format.has_wordtagger()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word tagger.");
        }
        
        const auto& wordTagger = format.wordtagger();
        
        int numNonEmptyOutputFeatures = 0;
        
        if (wordTagger.tokentagsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokensoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlocationsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlengthsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (outputs.size() != numNonEmptyOutputFeatures) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                          "More model output features than the output features of the word tagger model.");
        }        
        
        int tokensOutputIndex = -1;
        int tokenTagsOutputIndex = -1;
        int tokenLocationsOutputIndex = -1;
        int tokenLengthsOutputIndex = -1;
        
        // check that any interface output can be found from word tagger outputs
        for (int i = 0; i < outputs.size(); i++) {
            const std::string name = outputs[i].name();
            bool present = false;
            
            if (wordTagger.tokensoutputfeaturename().compare(name) == 0) {
                tokensOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokentagsoutputfeaturename().compare(name) == 0) {
                tokenTagsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlocationsoutputfeaturename().compare(name) == 0) {
                tokenLocationsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlengthsoutputfeaturename().compare(name) == 0) {
                tokenLengthsOutputIndex = i;
                present = true;
            }
            
            if (!present) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not required by the output features of the word tagger model.");
            }
        }
        
        // token tags is the required output feature name, while tokens/locations/lengths are optional
        if (tokenTagsOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + wordTagger.tokentagsoutputfeaturename() + "' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(inputs, 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only sequence type is allowed for any output
        result = validateDescriptionsContainFeatureWithTypes(outputs, outputs.size(), {Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // validate the individual output type, token tags has to be a sequence of strings
        const auto& tokenTagsOutputSequenceType = outputs[tokenTagsOutputIndex].type().sequencetype();
        if (tokenTagsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenTagsOutputSequenceType.Type_case()))
            << "\" for feature \"" << wordTagger.tokentagsoutputfeaturename() + "\". Should be: "
            << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
            
            return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
        }

        // validate the individual output type, tokens (if present) has to be a sequence of strings
        if (tokensOutputIndex != -1) {
            const auto& tokensOutputSequenceType = outputs[tokensOutputIndex].type().sequencetype();
            if (tokensOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokensOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokensoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token locations (if present) has to be a sequence of integers
        if (tokenLocationsOutputIndex != -1) {
            const auto& tokenLocationsOutputSequenceType = outputs[tokenLocationsOutputIndex].type().sequencetype();
            if (tokenLocationsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLocationsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlocationsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token lengths (if present) has to be a sequence of integers
        if (tokenLengthsOutputIndex != -1) {
            const auto& tokenLengthsOutputSequenceType = outputs[tokenLengthsOutputIndex].type().sequencetype();
            if (tokenLengthsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLengthsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlengthsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // Validate the model parameters
        if (wordTagger.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }

        int numTags;
        switch (wordTagger.Tags_case()) {
            case Specification::CoreMLModels::WordTagger::kStringTags:
                numTags = wordTagger.stringtags().vector_size();
                break;
            case Specification::CoreMLModels::WordTagger::TAGS_NOT_SET:
                numTags = -1;
                break;
        }
        
        if (numTags <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output tags not set. Must have at least one tag");
        }
        
        if (wordTagger.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }